

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

DdNode * Cudd_zddIthVar(DdManager *dd,int i)

{
  int *piVar1;
  DdNode **ppDVar2;
  DdNode *T;
  DdNode *pDVar3;
  long lVar4;
  
  if ((uint)i < 0x7ffffffe) {
    if (i < dd->sizeZ + -1) {
      ppDVar2 = dd->univ + (long)dd->permZ[(uint)i] + 1;
    }
    else {
      ppDVar2 = &dd->one;
    }
    pDVar3 = *ppDVar2;
    do {
      dd->reordered = 0;
      T = cuddUniqueInterZdd(dd,i,pDVar3,dd->zero);
    } while (dd->reordered == 1);
    if (T != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      lVar4 = (long)dd->permZ[(uint)i];
      while( true ) {
        if (lVar4 < 1) {
          piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          return T;
        }
        lVar4 = lVar4 + -1;
        do {
          dd->reordered = 0;
          pDVar3 = cuddUniqueInterZdd(dd,dd->invpermZ[lVar4],T,T);
        } while (dd->reordered == 1);
        if (pDVar3 == (DdNode *)0x0) break;
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDerefZdd(dd,T);
        T = pDVar3;
      }
      Cudd_RecursiveDerefZdd(dd,T);
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_zddIthVar(
  DdManager * dd,
  int  i)
{
    DdNode *res;
    DdNode *zvar;
    DdNode *lower;
    int j;

    if ((unsigned int) i >= CUDD_MAXINDEX - 1) return(NULL);

    /* The i-th variable function has the following structure:
    ** at the level corresponding to index i there is a node whose "then"
    ** child points to the universe, and whose "else" child points to zero.
    ** Above that level there are nodes with identical children.
    */

    /* First we build the node at the level of index i. */
    lower = (i < dd->sizeZ - 1) ? dd->univ[dd->permZ[i]+1] : DD_ONE(dd);
    do {
        dd->reordered = 0;
        zvar = cuddUniqueInterZdd(dd, i, lower, DD_ZERO(dd));
    } while (dd->reordered == 1);

    if (zvar == NULL)
        return(NULL);
    cuddRef(zvar);

    /* Now we add the "filler" nodes above the level of index i. */
    for (j = dd->permZ[i] - 1; j >= 0; j--) {
        do {
            dd->reordered = 0;
            res = cuddUniqueInterZdd(dd, dd->invpermZ[j], zvar, zvar);
        } while (dd->reordered == 1);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(dd,zvar);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDerefZdd(dd,zvar);
        zvar = res;
    }
    cuddDeref(zvar);
    return(zvar);

}